

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O3

void __thiscall QSimplex::~QSimplex(QSimplex *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  clearDataStructures(this);
  pDVar1 = (this->variables).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->variables).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar2 = (this->constraints).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->constraints).d.d)->super_QArrayData,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

QSimplex::~QSimplex()
{
    clearDataStructures();
}